

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boardtest.cc
# Opt level: O0

void __thiscall BoardTest_parseFenRuyLopez_Test::TestBody(BoardTest_parseFenRuyLopez_Test *this)

{
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l;
  bool bVar1;
  char *message;
  char *in_R9;
  allocator<std::pair<const_board::Square,_board::Piece>_> local_10a;
  less<board::Square> local_109;
  pair<const_board::Square,_board::Piece> local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  iterator local_d8;
  size_type local_d0;
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  local_c8;
  uint local_94;
  string local_90;
  AssertHelper local_70;
  Message local_68 [3];
  allocator<char> local_49;
  string local_48;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  BoardTest_parseFenRuyLopez_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3"
             ,&local_49);
  local_21 = board::Board::parseFen(&(this->super_BoardTest).pos,&local_48);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_20,
               (AssertionResult *)
               "pos.parseFen(\"r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3\")"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/test/unittest/boardtest.cc"
               ,0x29,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(local_68);
  }
  local_94 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (local_94 == 0) {
    local_f8 = 0x20000002e;
    uStack_f0 = 0x800000049;
    local_108.first = E4;
    local_108.second = WP;
    uStack_100 = 0x700000041;
    local_e8 = 0x30000003e;
    local_d8 = &local_108;
    local_d0 = 5;
    std::allocator<std::pair<const_board::Square,_board::Piece>_>::allocator(&local_10a);
    __l._M_len = local_d0;
    __l._M_array = local_d8;
    std::
    map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
    ::map(&local_c8,__l,&local_109,&local_10a);
    test::BoardTest::ASSERT_BOARD
              (&this->super_BoardTest,&(this->super_BoardTest).pos,&local_c8,BLACK,NO_SQ,3,0xf);
    std::
    map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
    ::~map(&local_c8);
    std::allocator<std::pair<const_board::Square,_board::Piece>_>::~allocator(&local_10a);
  }
  return;
}

Assistant:

TEST_F(BoardTest, parseFenRuyLopez)
{
    ASSERT_TRUE(pos.parseFen("r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3"));

    ASSERT_BOARD(pos,
                 {
                     {board::E4, board::WP},
                     {board::E5, board::BP},
                     {board::F3, board::WN},
                     {board::C6, board::BN},
                     {board::B5, board::WB},
                 },
                 board::BLACK, board::NO_SQ, 3);
}